

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double orient4dadapt(double *pa,double *pb,double *pc,double *pd,double *pe,double aheight,
                    double bheight,double cheight,double dheight,double eheight,double permanent)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int elen;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double b;
  double b_00;
  double b_01;
  double b_02;
  double dVar14;
  double b_03;
  double dVar15;
  double b_04;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double _0;
  double _j;
  double _i;
  double err3;
  double err2;
  double err1;
  double blo;
  double bhi;
  double alo;
  double ahi;
  double abig;
  double c;
  double around;
  double bround;
  double avirt;
  double bvirt;
  double deheighttail;
  double ceheighttail;
  double beheighttail;
  double aeheighttail;
  double deztail;
  double ceztail;
  double beztail;
  double aeztail;
  double deytail;
  double ceytail;
  double beytail;
  double aeytail;
  double dextail;
  double cextail;
  double bextail;
  double aextail;
  int finlength;
  double fin1 [192];
  int cdlen;
  int ablen;
  double cddet [96];
  double abdet [96];
  int dlen;
  int clen;
  int blen;
  int alen;
  double ddet [48];
  double cdet [48];
  double bdet [48];
  double adet [48];
  int temp24len;
  int temp16len;
  int temp8clen;
  int temp8blen;
  int temp8alen;
  double temp24 [24];
  double temp16 [16];
  double temp8c [8];
  double temp8b [8];
  double temp8a [8];
  double bdeps;
  double aceps;
  double daeps;
  double cdeps;
  double bceps;
  double abeps;
  double bd3;
  double ac3;
  double da3;
  double cd3;
  double bc3;
  double ab3;
  double bd [4];
  double ac [4];
  double da [4];
  double cd [4];
  double bc [4];
  double ab [4];
  double dexbey0;
  double bexdey0;
  double cexaey0;
  double aexcey0;
  double aexdey0;
  double dexaey0;
  double dexcey0;
  double cexdey0;
  double cexbey0;
  double bexcey0;
  double bexaey0;
  double aexbey0;
  double dexbey1;
  double bexdey1;
  double cexaey1;
  double aexcey1;
  double aexdey1;
  double dexaey1;
  double dexcey1;
  double cexdey1;
  double cexbey1;
  double bexcey1;
  double bexaey1;
  double aexbey1;
  double errbound;
  double det;
  double deheight;
  double ceheight;
  double beheight;
  double aeheight;
  double dez;
  double cez;
  double bez;
  double aez;
  double dey;
  double cey;
  double bey;
  double aey;
  double dex;
  double cex;
  double bex;
  double aex;
  double permanent_local;
  double eheight_local;
  double dheight_local;
  double cheight_local;
  double bheight_local;
  double aheight_local;
  double *pe_local;
  double *pd_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  dVar6 = *pa - *pe;
  dVar7 = *pb - *pe;
  dVar8 = *pc - *pe;
  dVar9 = *pd - *pe;
  dVar10 = pa[1] - pe[1];
  dVar11 = pb[1] - pe[1];
  dVar12 = pc[1] - pe[1];
  dVar13 = pd[1] - pe[1];
  b = pa[2] - pe[2];
  b_00 = pb[2] - pe[2];
  b_01 = pc[2] - pe[2];
  b_02 = pd[2] - pe[2];
  dVar14 = aheight - eheight;
  b_03 = bheight - eheight;
  dVar15 = cheight - eheight;
  b_04 = dheight - eheight;
  dVar16 = dVar6 * dVar11;
  dVar17 = splitter * dVar6 - (splitter * dVar6 - dVar6);
  dVar18 = splitter * dVar11 - (splitter * dVar11 - dVar11);
  dVar17 = (dVar6 - dVar17) * (dVar11 - dVar18) +
           -(-dVar17 * (dVar11 - dVar18) + -(dVar6 - dVar17) * dVar18 + -dVar17 * dVar18 + dVar16);
  dVar18 = splitter * dVar7 - (splitter * dVar7 - dVar7);
  dVar19 = splitter * dVar10 - (splitter * dVar10 - dVar10);
  dVar18 = (dVar7 - dVar18) * (dVar10 - dVar19) +
           -(-dVar18 * (dVar10 - dVar19) +
            -(dVar7 - dVar18) * dVar19 + -dVar18 * dVar19 + dVar7 * dVar10);
  dVar19 = dVar17 - dVar18;
  bc[3] = (dVar17 - (dVar19 + (dVar17 - dVar19))) + ((dVar17 - dVar19) - dVar18);
  dVar17 = dVar16 + dVar19;
  dVar17 = dVar17 + (((dVar16 - (dVar17 - (dVar17 - dVar16))) + (dVar19 - (dVar17 - dVar16))) -
                    dVar7 * dVar10);
  dVar16 = dVar7 * dVar12;
  dVar18 = splitter * dVar7 - (splitter * dVar7 - dVar7);
  dVar19 = splitter * dVar12 - (splitter * dVar12 - dVar12);
  dVar18 = (dVar7 - dVar18) * (dVar12 - dVar19) +
           -(-dVar18 * (dVar12 - dVar19) + -(dVar7 - dVar18) * dVar19 + -dVar18 * dVar19 + dVar16);
  dVar19 = dVar8 * dVar11;
  dVar20 = splitter * dVar8 - (splitter * dVar8 - dVar8);
  dVar21 = splitter * dVar11 - (splitter * dVar11 - dVar11);
  dVar20 = (dVar8 - dVar20) * (dVar11 - dVar21) +
           -(-dVar20 * (dVar11 - dVar21) + -(dVar8 - dVar20) * dVar21 + -dVar20 * dVar21 + dVar19);
  dVar21 = dVar18 - dVar20;
  cd[3] = (dVar18 - (dVar21 + (dVar18 - dVar21))) + ((dVar18 - dVar21) - dVar20);
  dVar18 = dVar16 + dVar21;
  dVar16 = (dVar16 - (dVar18 - (dVar18 - dVar16))) + (dVar21 - (dVar18 - dVar16));
  dVar20 = dVar16 - dVar19;
  bc[0] = (dVar16 - (dVar20 + (dVar16 - dVar20))) + ((dVar16 - dVar20) - dVar19);
  dVar16 = dVar18 + dVar20;
  bc[1] = (dVar18 - (dVar16 - (dVar16 - dVar18))) + (dVar20 - (dVar16 - dVar18));
  dVar18 = dVar8 * dVar13;
  dVar19 = splitter * dVar8 - (splitter * dVar8 - dVar8);
  dVar20 = splitter * dVar13 - (splitter * dVar13 - dVar13);
  dVar19 = (dVar8 - dVar19) * (dVar13 - dVar20) +
           -(-dVar19 * (dVar13 - dVar20) + -(dVar8 - dVar19) * dVar20 + -dVar19 * dVar20 + dVar18);
  dVar20 = dVar9 * dVar12;
  dVar21 = splitter * dVar9 - (splitter * dVar9 - dVar9);
  dVar22 = splitter * dVar12 - (splitter * dVar12 - dVar12);
  dVar21 = (dVar9 - dVar21) * (dVar12 - dVar22) +
           -(-dVar21 * (dVar12 - dVar22) + -(dVar9 - dVar21) * dVar22 + -dVar21 * dVar22 + dVar20);
  dVar22 = dVar19 - dVar21;
  da[3] = (dVar19 - (dVar22 + (dVar19 - dVar22))) + ((dVar19 - dVar22) - dVar21);
  dVar19 = dVar18 + dVar22;
  dVar18 = (dVar18 - (dVar19 - (dVar19 - dVar18))) + (dVar22 - (dVar19 - dVar18));
  dVar21 = dVar18 - dVar20;
  cd[0] = (dVar18 - (dVar21 + (dVar18 - dVar21))) + ((dVar18 - dVar21) - dVar20);
  dVar18 = dVar19 + dVar21;
  cd[1] = (dVar19 - (dVar18 - (dVar18 - dVar19))) + (dVar21 - (dVar18 - dVar19));
  dVar19 = dVar9 * dVar10;
  dVar20 = splitter * dVar9 - (splitter * dVar9 - dVar9);
  dVar21 = splitter * dVar10 - (splitter * dVar10 - dVar10);
  dVar20 = (dVar9 - dVar20) * (dVar10 - dVar21) +
           -(-dVar20 * (dVar10 - dVar21) + -(dVar9 - dVar20) * dVar21 + -dVar20 * dVar21 + dVar19);
  dVar21 = dVar6 * dVar13;
  dVar22 = splitter * dVar6 - (splitter * dVar6 - dVar6);
  dVar23 = splitter * dVar13 - (splitter * dVar13 - dVar13);
  dVar22 = (dVar6 - dVar22) * (dVar13 - dVar23) +
           -(-dVar22 * (dVar13 - dVar23) + -(dVar6 - dVar22) * dVar23 + -dVar22 * dVar23 + dVar21);
  dVar23 = dVar20 - dVar22;
  ac[3] = (dVar20 - (dVar23 + (dVar20 - dVar23))) + ((dVar20 - dVar23) - dVar22);
  dVar20 = dVar19 + dVar23;
  dVar19 = (dVar19 - (dVar20 - (dVar20 - dVar19))) + (dVar23 - (dVar20 - dVar19));
  dVar22 = dVar19 - dVar21;
  da[0] = (dVar19 - (dVar22 + (dVar19 - dVar22))) + ((dVar19 - dVar22) - dVar21);
  dVar19 = dVar20 + dVar22;
  da[1] = (dVar20 - (dVar19 - (dVar19 - dVar20))) + (dVar22 - (dVar19 - dVar20));
  dVar20 = dVar6 * dVar12;
  dVar21 = splitter * dVar6 - (splitter * dVar6 - dVar6);
  dVar22 = splitter * dVar12 - (splitter * dVar12 - dVar12);
  dVar21 = (dVar6 - dVar21) * (dVar12 - dVar22) +
           -(-dVar21 * (dVar12 - dVar22) + -(dVar6 - dVar21) * dVar22 + -dVar21 * dVar22 + dVar20);
  dVar22 = dVar8 * dVar10;
  dVar23 = splitter * dVar8 - (splitter * dVar8 - dVar8);
  dVar24 = splitter * dVar10 - (splitter * dVar10 - dVar10);
  dVar23 = (dVar8 - dVar23) * (dVar10 - dVar24) +
           -(-dVar23 * (dVar10 - dVar24) + -(dVar8 - dVar23) * dVar24 + -dVar23 * dVar24 + dVar22);
  dVar24 = dVar21 - dVar23;
  bd[3] = (dVar21 - (dVar24 + (dVar21 - dVar24))) + ((dVar21 - dVar24) - dVar23);
  dVar21 = dVar20 + dVar24;
  dVar20 = (dVar20 - (dVar21 - (dVar21 - dVar20))) + (dVar24 - (dVar21 - dVar20));
  dVar23 = dVar20 - dVar22;
  ac[0] = (dVar20 - (dVar23 + (dVar20 - dVar23))) + ((dVar20 - dVar23) - dVar22);
  dVar20 = dVar21 + dVar23;
  ac[1] = (dVar21 - (dVar20 - (dVar20 - dVar21))) + (dVar23 - (dVar20 - dVar21));
  dVar21 = dVar7 * dVar13;
  dVar22 = splitter * dVar7 - (splitter * dVar7 - dVar7);
  dVar23 = splitter * dVar13 - (splitter * dVar13 - dVar13);
  dVar22 = (dVar7 - dVar22) * (dVar13 - dVar23) +
           -(-dVar22 * (dVar13 - dVar23) + -(dVar7 - dVar22) * dVar23 + -dVar22 * dVar23 + dVar21);
  dVar23 = dVar9 * dVar11;
  dVar24 = splitter * dVar9 - (splitter * dVar9 - dVar9);
  dVar25 = splitter * dVar11 - (splitter * dVar11 - dVar11);
  dVar24 = (dVar9 - dVar24) * (dVar11 - dVar25) +
           -(-dVar24 * (dVar11 - dVar25) + -(dVar9 - dVar24) * dVar25 + -dVar24 * dVar25 + dVar23);
  dVar25 = dVar22 - dVar24;
  ab3 = (dVar22 - (dVar25 + (dVar22 - dVar25))) + ((dVar22 - dVar25) - dVar24);
  dVar22 = dVar21 + dVar25;
  dVar21 = (dVar21 - (dVar22 - (dVar22 - dVar21))) + (dVar25 - (dVar22 - dVar21));
  dVar24 = dVar21 - dVar23;
  bd[0] = (dVar21 - (dVar24 + (dVar21 - dVar24))) + ((dVar21 - dVar24) - dVar23);
  dVar21 = dVar22 + dVar24;
  bd[1] = (dVar22 - (dVar21 - (dVar21 - dVar22))) + (dVar24 - (dVar21 - dVar22));
  bd[2] = dVar21;
  ac[2] = dVar20;
  da[2] = dVar19;
  cd[2] = dVar18;
  bc[2] = dVar16;
  iVar1 = scale_expansion_zeroelim(4,da + 3,b_00,temp8b + 7);
  iVar2 = scale_expansion_zeroelim(4,&ab3,-b_01,temp8c + 7);
  iVar3 = scale_expansion_zeroelim(4,cd + 3,b_02,temp16 + 0xf);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,temp8b + 7,iVar2,temp8c + 7,temp24 + 0x17);
  iVar1 = fast_expansion_sum_zeroelim(iVar3,temp16 + 0xf,iVar1,temp24 + 0x17,(double *)&temp8blen);
  iVar1 = scale_expansion_zeroelim(iVar1,(double *)&temp8blen,-dVar14,bdet + 0x2f);
  iVar2 = scale_expansion_zeroelim(4,ac + 3,b_01,temp8b + 7);
  iVar3 = scale_expansion_zeroelim(4,bd + 3,b_02,temp8c + 7);
  iVar4 = scale_expansion_zeroelim(4,da + 3,b,temp16 + 0xf);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,temp8b + 7,iVar3,temp8c + 7,temp24 + 0x17);
  iVar2 = fast_expansion_sum_zeroelim(iVar4,temp16 + 0xf,iVar2,temp24 + 0x17,(double *)&temp8blen);
  iVar2 = scale_expansion_zeroelim(iVar2,(double *)&temp8blen,b_03,cdet + 0x2f);
  iVar3 = scale_expansion_zeroelim(4,bc + 3,b_02,temp8b + 7);
  iVar4 = scale_expansion_zeroelim(4,&ab3,b,temp8c + 7);
  iVar5 = scale_expansion_zeroelim(4,ac + 3,b_00,temp16 + 0xf);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,temp8b + 7,iVar4,temp8c + 7,temp24 + 0x17);
  iVar3 = fast_expansion_sum_zeroelim(iVar5,temp16 + 0xf,iVar3,temp24 + 0x17,(double *)&temp8blen);
  iVar3 = scale_expansion_zeroelim(iVar3,(double *)&temp8blen,-dVar15,ddet + 0x2f);
  iVar4 = scale_expansion_zeroelim(4,cd + 3,b,temp8b + 7);
  iVar5 = scale_expansion_zeroelim(4,bd + 3,-b_00,temp8c + 7);
  elen = scale_expansion_zeroelim(4,bc + 3,b_01,temp16 + 0xf);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,temp8b + 7,iVar5,temp8c + 7,temp24 + 0x17);
  iVar4 = fast_expansion_sum_zeroelim(elen,temp16 + 0xf,iVar4,temp24 + 0x17,(double *)&temp8blen);
  iVar4 = scale_expansion_zeroelim(iVar4,(double *)&temp8blen,b_04,(double *)&blen);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,bdet + 0x2f,iVar2,cdet + 0x2f,cddet + 0x5f);
  iVar2 = fast_expansion_sum_zeroelim(iVar3,ddet + 0x2f,iVar4,(double *)&blen,(double *)&cdlen);
  iVar1 = fast_expansion_sum_zeroelim
                    (iVar1,cddet + 0x5f,iVar2,(double *)&cdlen,(double *)&stack0xffffffffffffe8e8);
  pa_local = (double *)estimate(iVar1,(double *)&stack0xffffffffffffe8e8);
  if (((double)pa_local < isperrboundB * permanent) &&
     (-(double)pa_local < isperrboundB * permanent)) {
    dVar22 = (*pa - (dVar6 + (*pa - dVar6))) + ((*pa - dVar6) - *pe);
    dVar23 = (pa[1] - (dVar10 + (pa[1] - dVar10))) + ((pa[1] - dVar10) - pe[1]);
    dVar24 = (pa[2] - (b + (pa[2] - b))) + ((pa[2] - b) - pe[2]);
    dVar25 = (aheight - (dVar14 + (aheight - dVar14))) + ((aheight - dVar14) - eheight);
    dVar26 = (*pb - (dVar7 + (*pb - dVar7))) + ((*pb - dVar7) - *pe);
    dVar27 = (pb[1] - (dVar11 + (pb[1] - dVar11))) + ((pb[1] - dVar11) - pe[1]);
    dVar28 = (pb[2] - (b_00 + (pb[2] - b_00))) + ((pb[2] - b_00) - pe[2]);
    dVar29 = (bheight - (b_03 + (bheight - b_03))) + ((bheight - b_03) - eheight);
    dVar30 = (*pc - (dVar8 + (*pc - dVar8))) + ((*pc - dVar8) - *pe);
    dVar31 = (pc[1] - (dVar12 + (pc[1] - dVar12))) + ((pc[1] - dVar12) - pe[1]);
    dVar32 = (pc[2] - (b_01 + (pc[2] - b_01))) + ((pc[2] - b_01) - pe[2]);
    dVar33 = (cheight - (dVar15 + (cheight - dVar15))) + ((cheight - dVar15) - eheight);
    dVar34 = (*pd - (dVar9 + (*pd - dVar9))) + ((*pd - dVar9) - *pe);
    dVar35 = (pd[1] - (dVar13 + (pd[1] - dVar13))) + ((pd[1] - dVar13) - pe[1]);
    dVar36 = (pd[2] - (b_02 + (pd[2] - b_02))) + ((pd[2] - b_02) - pe[2]);
    dVar37 = (dheight - (b_04 + (dheight - b_04))) + ((dheight - b_04) - eheight);
    if ((((((dVar22 != 0.0) || (((NAN(dVar22) || (dVar23 != 0.0)) || (NAN(dVar23))))) ||
          (((dVar24 != 0.0 || (NAN(dVar24))) || (dVar26 != 0.0)))) ||
         ((((NAN(dVar26) || (dVar27 != 0.0)) ||
           ((NAN(dVar27) ||
            (((((dVar28 != 0.0 || (NAN(dVar28))) || (dVar30 != 0.0)) ||
              ((NAN(dVar30) || (dVar31 != 0.0)))) || (NAN(dVar31))))))) ||
          ((dVar32 != 0.0 || (NAN(dVar32))))))) ||
        ((dVar34 != 0.0 ||
         (((((NAN(dVar34) || (dVar35 != 0.0)) || (NAN(dVar35))) ||
           (((dVar36 != 0.0 || (NAN(dVar36))) ||
            ((dVar25 != 0.0 || ((NAN(dVar25) || (dVar29 != 0.0)))))))) || (NAN(dVar29))))))) ||
       ((((dVar33 != 0.0 || (NAN(dVar33))) || (dVar37 != 0.0)) || (NAN(dVar37))))) {
      dVar38 = isperrboundC * permanent + resulterrbound * ABS((double)pa_local);
      dVar39 = (dVar6 * dVar27 + dVar11 * dVar22) - (dVar10 * dVar26 + dVar7 * dVar23);
      dVar40 = (dVar7 * dVar31 + dVar12 * dVar26) - (dVar11 * dVar30 + dVar8 * dVar27);
      dVar41 = (dVar8 * dVar35 + dVar13 * dVar30) - (dVar12 * dVar34 + dVar9 * dVar31);
      dVar42 = (dVar9 * dVar23 + dVar10 * dVar34) - (dVar13 * dVar22 + dVar6 * dVar35);
      dVar6 = (dVar6 * dVar31 + dVar12 * dVar22) - (dVar10 * dVar30 + dVar8 * dVar23);
      dVar7 = (dVar7 * dVar35 + dVar13 * dVar26) - (dVar11 * dVar34 + dVar9 * dVar27);
      pa_local = (double *)
                 (((b_03 * (b * dVar41 + b_01 * dVar42 + b_02 * dVar6 +
                           dVar24 * dVar18 + dVar32 * dVar19 + dVar36 * dVar20) +
                   b_04 * (b_01 * dVar39 + b * dVar40 + -(b_00 * dVar6) +
                          dVar32 * dVar17 + dVar24 * dVar16 + -(dVar28 * dVar20))) -
                  (dVar14 * (b_02 * dVar40 + b_00 * dVar41 + -(b_01 * dVar7) +
                            dVar36 * dVar16 + dVar28 * dVar18 + -(dVar32 * dVar21)) +
                  dVar15 * (b_00 * dVar42 + b_02 * dVar39 + b * dVar7 +
                           dVar28 * dVar19 + dVar36 * dVar17 + dVar24 * dVar21))) +
                  ((dVar29 * (b * dVar18 + b_01 * dVar19 + b_02 * dVar20) +
                   dVar37 * (b_01 * dVar17 + b * dVar16 + -(b_00 * dVar20))) -
                  (dVar25 * (b_02 * dVar16 + b_00 * dVar18 + -(b_01 * dVar21)) +
                  dVar33 * (b_00 * dVar19 + b_02 * dVar17 + b * dVar21))) + (double)pa_local);
      if (((double)pa_local < dVar38) && (-(double)pa_local < dVar38)) {
        pa_local = (double *)orient4dexact(pa,pb,pc,pd,pe,aheight,bheight,cheight,dheight,eheight);
      }
    }
  }
  return (double)pa_local;
}

Assistant:

REAL orient4dadapt(REAL* pa, REAL* pb, REAL* pc, REAL* pd, REAL* pe,
                   REAL aheight, REAL bheight, REAL cheight, REAL dheight, 
                   REAL eheight, REAL permanent)
{
  INEXACT REAL aex, bex, cex, dex, aey, bey, cey, dey, aez, bez, cez, dez;
  INEXACT REAL aeheight, beheight, ceheight, deheight;
  REAL det, errbound;

  INEXACT REAL aexbey1, bexaey1, bexcey1, cexbey1;
  INEXACT REAL cexdey1, dexcey1, dexaey1, aexdey1;
  INEXACT REAL aexcey1, cexaey1, bexdey1, dexbey1;
  REAL aexbey0, bexaey0, bexcey0, cexbey0;
  REAL cexdey0, dexcey0, dexaey0, aexdey0;
  REAL aexcey0, cexaey0, bexdey0, dexbey0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  INEXACT REAL ab3, bc3, cd3, da3, ac3, bd3;
  REAL abeps, bceps, cdeps, daeps, aceps, bdeps;
  REAL temp8a[8], temp8b[8], temp8c[8], temp16[16], temp24[24];
  int temp8alen, temp8blen, temp8clen, temp16len, temp24len;
  REAL adet[48], bdet[48], cdet[48], ddet[48];
  int alen, blen, clen, dlen;
  REAL abdet[96], cddet[96];
  int ablen, cdlen;
  REAL fin1[192];
  int finlength;

  REAL aextail, bextail, cextail, dextail;
  REAL aeytail, beytail, ceytail, deytail;
  REAL aeztail, beztail, ceztail, deztail;
  REAL aeheighttail, beheighttail, ceheighttail, deheighttail;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;


  aex = (REAL) (pa[0] - pe[0]);
  bex = (REAL) (pb[0] - pe[0]);
  cex = (REAL) (pc[0] - pe[0]);
  dex = (REAL) (pd[0] - pe[0]);
  aey = (REAL) (pa[1] - pe[1]);
  bey = (REAL) (pb[1] - pe[1]);
  cey = (REAL) (pc[1] - pe[1]);
  dey = (REAL) (pd[1] - pe[1]);
  aez = (REAL) (pa[2] - pe[2]);
  bez = (REAL) (pb[2] - pe[2]);
  cez = (REAL) (pc[2] - pe[2]);
  dez = (REAL) (pd[2] - pe[2]);
  aeheight = (REAL) (aheight - eheight);
  beheight = (REAL) (bheight - eheight);
  ceheight = (REAL) (cheight - eheight);
  deheight = (REAL) (dheight - eheight);

  Two_Product(aex, bey, aexbey1, aexbey0);
  Two_Product(bex, aey, bexaey1, bexaey0);
  Two_Two_Diff(aexbey1, aexbey0, bexaey1, bexaey0, ab3, ab[2], ab[1], ab[0]);
  ab[3] = ab3;

  Two_Product(bex, cey, bexcey1, bexcey0);
  Two_Product(cex, bey, cexbey1, cexbey0);
  Two_Two_Diff(bexcey1, bexcey0, cexbey1, cexbey0, bc3, bc[2], bc[1], bc[0]);
  bc[3] = bc3;

  Two_Product(cex, dey, cexdey1, cexdey0);
  Two_Product(dex, cey, dexcey1, dexcey0);
  Two_Two_Diff(cexdey1, cexdey0, dexcey1, dexcey0, cd3, cd[2], cd[1], cd[0]);
  cd[3] = cd3;

  Two_Product(dex, aey, dexaey1, dexaey0);
  Two_Product(aex, dey, aexdey1, aexdey0);
  Two_Two_Diff(dexaey1, dexaey0, aexdey1, aexdey0, da3, da[2], da[1], da[0]);
  da[3] = da3;

  Two_Product(aex, cey, aexcey1, aexcey0);
  Two_Product(cex, aey, cexaey1, cexaey0);
  Two_Two_Diff(aexcey1, aexcey0, cexaey1, cexaey0, ac3, ac[2], ac[1], ac[0]);
  ac[3] = ac3;

  Two_Product(bex, dey, bexdey1, bexdey0);
  Two_Product(dex, bey, dexbey1, dexbey0);
  Two_Two_Diff(bexdey1, bexdey0, dexbey1, dexbey0, bd3, bd[2], bd[1], bd[0]);
  bd[3] = bd3;

  temp8alen = scale_expansion_zeroelim(4, cd, bez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, -cez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, bc, dez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  alen = scale_expansion_zeroelim(temp24len, temp24, -aeheight, adet);

  temp8alen = scale_expansion_zeroelim(4, da, cez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, dez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, cd, aez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  blen = scale_expansion_zeroelim(temp24len, temp24, beheight, bdet);

  temp8alen = scale_expansion_zeroelim(4, ab, dez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, aez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, da, bez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  clen = scale_expansion_zeroelim(temp24len, temp24, -ceheight, cdet);

  temp8alen = scale_expansion_zeroelim(4, bc, aez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, -bez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, ab, cez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  dlen = scale_expansion_zeroelim(temp24len, temp24, deheight, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  finlength = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, fin1);

  det = estimate(finlength, fin1);
  errbound = isperrboundB * permanent;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Diff_Tail(pa[0], pe[0], aex, aextail);
  Two_Diff_Tail(pa[1], pe[1], aey, aeytail);
  Two_Diff_Tail(pa[2], pe[2], aez, aeztail);
  Two_Diff_Tail(aheight, eheight, aeheight, aeheighttail);
  Two_Diff_Tail(pb[0], pe[0], bex, bextail);
  Two_Diff_Tail(pb[1], pe[1], bey, beytail);
  Two_Diff_Tail(pb[2], pe[2], bez, beztail);
  Two_Diff_Tail(bheight, eheight, beheight, beheighttail);
  Two_Diff_Tail(pc[0], pe[0], cex, cextail);
  Two_Diff_Tail(pc[1], pe[1], cey, ceytail);
  Two_Diff_Tail(pc[2], pe[2], cez, ceztail);
  Two_Diff_Tail(cheight, eheight, ceheight, ceheighttail);
  Two_Diff_Tail(pd[0], pe[0], dex, dextail);
  Two_Diff_Tail(pd[1], pe[1], dey, deytail);
  Two_Diff_Tail(pd[2], pe[2], dez, deztail);
  Two_Diff_Tail(dheight, eheight, deheight, deheighttail);
  if ((aextail == 0.0) && (aeytail == 0.0) && (aeztail == 0.0)
      && (bextail == 0.0) && (beytail == 0.0) && (beztail == 0.0)
      && (cextail == 0.0) && (ceytail == 0.0) && (ceztail == 0.0)
      && (dextail == 0.0) && (deytail == 0.0) && (deztail == 0.0)
      && (aeheighttail == 0.0) && (beheighttail == 0.0)
      && (ceheighttail == 0.0) && (deheighttail == 0.0)) {
    return det;
  }

  errbound = isperrboundC * permanent + resulterrbound * Absolute(det);
  abeps = (aex * beytail + bey * aextail)
        - (aey * bextail + bex * aeytail);
  bceps = (bex * ceytail + cey * bextail)
        - (bey * cextail + cex * beytail);
  cdeps = (cex * deytail + dey * cextail)
        - (cey * dextail + dex * ceytail);
  daeps = (dex * aeytail + aey * dextail)
        - (dey * aextail + aex * deytail);
  aceps = (aex * ceytail + cey * aextail)
        - (aey * cextail + cex * aeytail);
  bdeps = (bex * deytail + dey * bextail)
        - (bey * dextail + dex * beytail);
  det += ((beheight
           * ((cez * daeps + dez * aceps + aez * cdeps)
              + (ceztail * da3 + deztail * ac3 + aeztail * cd3))
           + deheight
           * ((aez * bceps - bez * aceps + cez * abeps)
              + (aeztail * bc3 - beztail * ac3 + ceztail * ab3)))
          - (aeheight
           * ((bez * cdeps - cez * bdeps + dez * bceps)
              + (beztail * cd3 - ceztail * bd3 + deztail * bc3))
           + ceheight
           * ((dez * abeps + aez * bdeps + bez * daeps)
              + (deztail * ab3 + aeztail * bd3 + beztail * da3))))
       + ((beheighttail * (cez * da3 + dez * ac3 + aez * cd3)
           + deheighttail * (aez * bc3 - bez * ac3 + cez * ab3))
          - (aeheighttail * (bez * cd3 - cez * bd3 + dez * bc3)
           + ceheighttail * (dez * ab3 + aez * bd3 + bez * da3)));
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  return orient4dexact(pa, pb, pc, pd, pe,
                       aheight, bheight, cheight, dheight, eheight);
}